

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O3

void __thiscall
CQueue::
AddToQueue<void(*)(char_data*,char_data*,speech_data*),char_data*&,char_data*&,speech_data*&>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_char_data_ptr_speech_data_ptr *func,char_data **args,
          char_data **args_1,speech_data **args_2)

{
  pointer pcVar1;
  char_data *pcVar2;
  char_data *pcVar3;
  speech_data *psVar4;
  string *args_00;
  _func_void_char_data_ptr_char_data_ptr_speech_data_ptr *p_Var5;
  string_view fmt;
  string_view fmt_00;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  tuple<char_data_*&,_char_data_*&,_speech_data_*&> tuple;
  int local_fc;
  string *local_f8;
  CQueue *local_f0;
  _func_void_char_data_ptr_char_data_ptr_speech_data_ptr *local_e8;
  vector<char_data_*,_std::allocator<char_data_*>_> local_e0;
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  vector<char_data_*,_std::allocator<char_data_*>_> local_80;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  tuple<char_data_*&,_char_data_*&,_speech_data_*&> local_48;
  
  local_fc = nTimer;
  local_e8 = func;
  if (nTimer < 0) {
    local_c8 = (undefined1  [8])0x3;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_c8);
  }
  local_48.super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_speech_data_*&>.
  super__Tuple_impl<1UL,_char_data_*&,_speech_data_*&>.super__Tuple_impl<2UL,_speech_data_*&>.
  super__Head_base<2UL,_speech_data_*&,_false>._M_head_impl =
       (_Head_base<2UL,_speech_data_*&,_false>)(_Head_base<2UL,_speech_data_*&,_false>)args_2;
  local_48.super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_speech_data_*&>.
  super__Tuple_impl<1UL,_char_data_*&,_speech_data_*&>.super__Head_base<1UL,_char_data_*&,_false>.
  _M_head_impl = args_1;
  local_f0 = this;
  local_48.super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_speech_data_*&>.
  super__Head_base<0UL,_char_data_*&,_false>._M_head_impl = args;
  GetCharacterData<char_data*&,char_data*&,speech_data*&>(&local_e0,this,&local_48);
  local_c8._0_4_ = nTimer;
  local_c0._M_p = (pointer)&local_b0;
  pcVar1 = (from->_M_dataplus)._M_p;
  local_f8 = from;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + from->_M_string_length);
  local_a0._M_p = (pointer)&local_90;
  pcVar1 = (funcName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + funcName->_M_string_length);
  p_Var5 = local_e8;
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_80,&local_e0);
  pcVar2 = *args;
  pcVar3 = *args_1;
  psVar4 = *args_2;
  local_58 = (_Manager_type)0x0;
  p_Stack_50 = (_Invoker_type)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._M_unused._M_object = operator_new(0x20);
  *(_func_void_char_data_ptr_char_data_ptr_speech_data_ptr **)local_68._M_unused._0_8_ = p_Var5;
  *(char_data **)((long)local_68._M_unused._0_8_ + 8) = pcVar2;
  *(char_data **)((long)local_68._M_unused._0_8_ + 0x10) = pcVar3;
  *(speech_data **)((long)local_68._M_unused._0_8_ + 0x18) = psVar4;
  p_Stack_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/queue.h:45:52)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/queue.h:45:52)>
             ::_M_manager;
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&local_f0->newQueue,(queueEntry_t *)local_c8);
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  args_00 = local_f8;
  if (local_80.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != &local_90) {
    operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
  }
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,args_00,funcName,&local_fc);
  if (local_e0.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}